

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O1

Expression * __thiscall
wasm::TranslateToFuzzReader::makeRefFuncConst(TranslateToFuzzReader *this,Type type)

{
  Function *pFVar1;
  size_t sVar2;
  char *pcVar3;
  pointer puVar4;
  pointer puVar5;
  Type TVar6;
  __uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true> _Var7;
  undefined8 uVar8;
  undefined8 uVar9;
  Module *module;
  char cVar10;
  int iVar11;
  int iVar12;
  uint32_t uVar13;
  HeapType HVar14;
  Expression *pEVar15;
  Expression *pEVar16;
  variant_alternative_t<0UL,_variant<vector<HeapType,_allocator<HeapType>_>,_Error>_> *pvVar17;
  byte *pbVar18;
  undefined8 *puVar19;
  ulong uVar20;
  long extraout_RDX;
  Name NVar21;
  Name name;
  _Variadic_union<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  local_88;
  byte local_70;
  Expression *local_60;
  uint32_t local_58;
  int local_54;
  Type local_50;
  Type type_local;
  HeapType heapType;
  Function *local_38;
  TypeBuilder builder;
  
  local_50.id = type.id;
  type_local.id = (uintptr_t)Type::getHeapType(&local_50);
  iVar11 = wasm::HeapType::getShared();
  if (type_local.id < 0x7d) {
    if (((uint)type_local.id & 0x7b) != 0x10) {
      __assert_fail("heapType.getBasic(Unshared) == HeapType::func",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                    ,0xcff,"Expression *wasm::TranslateToFuzzReader::makeRefFuncConst(Type)");
    }
    if (((this->funcContext != (FunctionCreationContext *)0x0) &&
        (iVar12 = wasm::HeapType::getShared(), iVar12 == iVar11)) &&
       (uVar13 = Random::upTo(&this->random,4), uVar13 != 0)) {
      pFVar1 = this->funcContext->func;
      sVar2 = (pFVar1->super_Importable).super_Named.name.super_IString.str._M_len;
      pcVar3 = (pFVar1->super_Importable).super_Named.name.super_IString.str._M_str;
      HVar14.id = (uintptr_t)MixedArena::allocSpace(&((this->builder).wasm)->allocator,0x20,8);
      *(undefined1 *)HVar14.id = 0x2b;
      *(undefined8 *)(HVar14.id + 8) = 0;
      *(undefined8 *)(HVar14.id + 0x10) = 0;
      *(size_t *)(HVar14.id + 0x10) = sVar2;
      *(char **)(HVar14.id + 0x18) = pcVar3;
      goto LAB_00145d35;
    }
  }
  puVar4 = (this->wasm->functions).
           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar5 = (this->wasm->functions).
           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar4 != puVar5) {
    local_54 = iVar11;
    local_58 = Random::upTo(&this->random,(uint32_t)((ulong)((long)puVar5 - (long)puVar4) >> 3));
    uVar20 = (ulong)local_58;
    do {
      puVar4 = (this->wasm->functions).
               super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      TVar6.id = *(uintptr_t *)
                  ((long)puVar4[uVar20 & 0xffffffff]._M_t.
                         super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                  + 0x38);
      if (((uint)(0x7c < TVar6.id) * 4 + 3 & (uint)TVar6.id) != 0) {
        __assert_fail("!(heapType.getID() & (TupleMask | NullMask | (heapType.isBasic() ? 0 : ExactMask)))"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                      ,0x14c,"wasm::Type::Type(HeapType, Nullability, Exactness)");
      }
      cVar10 = wasm::Type::isSubType(TVar6,local_50);
      if (cVar10 != '\0') {
        _Var7.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
        super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
        super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl =
             puVar4[uVar20 & 0xffffffff]._M_t.
             super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>;
        uVar8 = *(undefined8 *)
                 _Var7.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
                 _M_t.super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                 .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
        uVar9 = *(undefined8 *)
                 ((long)_Var7.
                        super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                        .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 8);
        local_60 = (Expression *)MixedArena::allocSpace(&((this->builder).wasm)->allocator,0x20,8);
        *(undefined1 *)local_60 = 0x2b;
        *(undefined8 *)((long)local_60 + 8) = 0;
        *(undefined8 *)((long)local_60 + 0x10) = 0;
        *(undefined8 *)((long)local_60 + 0x10) = uVar8;
        *(undefined8 *)((long)local_60 + 0x18) = uVar9;
        wasm::RefFunc::finalize((HeapType)local_60);
        return local_60;
      }
      uVar20 = (ulong)((int)uVar20 + 1) %
               (ulong)((long)(this->wasm->functions).
                             super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->wasm->functions).
                             super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 3);
      iVar11 = local_54;
    } while ((uint32_t)uVar20 != local_58);
  }
  if (((((uint)local_50.id & 3) == 2 && 6 < local_50.id) &&
      (uVar13 = Random::upTo(&this->random,2), uVar13 == 0)) ||
     (((local_50.id & 3) == 0 && 6 < local_50.id &&
      ((uVar13 = Random::upTo(&this->random,0x10), uVar13 == 0 &&
       (this->funcContext != (FunctionCreationContext *)0x0)))))) {
    pEVar15 = (Expression *)
              Builder::makeRefNull(&this->builder,(HeapType)((ulong)(iVar11 == 0) * 4 + 0x68));
    if (6 < local_50.id && ((uint)local_50.id & 3) == 2) {
      return pEVar15;
    }
    if (this->funcContext != (FunctionCreationContext *)0x0) {
      pEVar16 = (Expression *)MixedArena::allocSpace(&((this->builder).wasm)->allocator,0x20,8);
      (((SpecificExpression<(wasm::Expression::Id)41> *)&pEVar16->_id)->super_Expression)._id =
           RefAsId;
      (pEVar16->type).id = 0;
      *(undefined4 *)(pEVar16 + 1) = 0;
      pEVar16[1].type.id = (uintptr_t)pEVar15;
      wasm::RefAs::finalize();
      return pEVar16;
    }
    __assert_fail("funcContext",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                  ,0xd1d,"Expression *wasm::TranslateToFuzzReader::makeRefFuncConst(Type)");
  }
  if (type_local.id < 0x7d) {
    wasm::TypeBuilder::TypeBuilder((TypeBuilder *)&local_38,1);
    wasm::TypeBuilder::setHeapType((ulong)&local_38,(Signature)ZEXT816(0));
    wasm::TypeBuilder::setShared((ulong)&local_38,Shared);
    wasm::TypeBuilder::build();
    pvVar17 = std::
              get<0ul,std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>,wasm::TypeBuilder::Error>
                        ((variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                          *)&local_88._M_first);
    type_local.id =
         ((pvVar17->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>)._M_impl.
          super__Vector_impl_data._M_start)->id;
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>_&>
      ::_S_vtable._M_arr[local_70]._M_data)
              ((anon_class_1_0_00000001 *)((long)&heapType.id + 7),
               (variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                *)&local_88._M_first);
    wasm::TypeBuilder::~TypeBuilder((TypeBuilder *)&local_38);
  }
  wasm::HeapType::getSignature();
  pbVar18 = (byte *)MixedArena::allocSpace(&((this->builder).wasm)->allocator,0x10,8);
  *pbVar18 = extraout_RDX != 0 | 0x16;
  *(ulong *)(pbVar18 + 8) = (ulong)(extraout_RDX != 0);
  module = this->wasm;
  NVar21.super_IString.str = (IString)wasm::IString::interned(0xf,"ref_func_target",0);
  NVar21 = Names::getValidFunctionName(module,NVar21);
  local_88._0_8_ = (void *)0x0;
  local_88._8_8_ = 0;
  local_88._16_8_ = 0;
  name.super_IString.str._M_str = NVar21.super_IString.str._M_len;
  name.super_IString.str._M_len = (size_t)&local_38;
  Builder::makeFunction
            (name,(HeapType)NVar21.super_IString.str._M_str,
             (vector<wasm::Type,_std::allocator<wasm::Type>_> *)type_local.id,
             (Expression *)&local_88._M_first);
  puVar19 = (undefined8 *)wasm::Module::addFunction((unique_ptr *)module);
  if (local_38 != (Function *)0x0) {
    std::default_delete<wasm::Function>::operator()
              ((default_delete<wasm::Function> *)&local_38,local_38);
  }
  local_38 = (Function *)0x0;
  if ((void *)local_88._0_8_ != (void *)0x0) {
    operator_delete((void *)local_88._0_8_,local_88._16_8_ - local_88._0_8_);
  }
  uVar8 = *puVar19;
  uVar9 = puVar19[1];
  HVar14.id = (uintptr_t)MixedArena::allocSpace(&((this->builder).wasm)->allocator,0x20,8);
  *(undefined1 *)HVar14.id = 0x2b;
  *(undefined8 *)(HVar14.id + 8) = 0;
  *(undefined8 *)(HVar14.id + 0x10) = 0;
  *(undefined8 *)(HVar14.id + 0x10) = uVar8;
  *(undefined8 *)(HVar14.id + 0x18) = uVar9;
LAB_00145d35:
  wasm::RefFunc::finalize(HVar14);
  return (Expression *)HVar14.id;
}

Assistant:

Expression* TranslateToFuzzReader::makeRefFuncConst(Type type) {
  auto heapType = type.getHeapType();
  auto share = heapType.getShared();
  if (heapType.isBasic()) {
    assert(heapType.getBasic(Unshared) == HeapType::func);
    // With high probability, use the last created function if possible.
    // Otherwise, continue on to select some other function.
    if (funcContext && funcContext->func->type.getShared() == share &&
        !oneIn(4)) {
      auto* target = funcContext->func;
      return builder.makeRefFunc(target->name, target->type);
    }
  }
  // Look for a proper function starting from a random location, and loop from
  // there, wrapping around to 0.
  if (!wasm.functions.empty()) {
    Index start = upTo(wasm.functions.size());
    Index i = start;
    do {
      auto& func = wasm.functions[i];
      if (Type::isSubType(Type(func->type, NonNullable), type)) {
        return builder.makeRefFunc(func->name, func->type);
      }
      i = (i + 1) % wasm.functions.size();
    } while (i != start);
  }
  // We don't have a matching function. Create a null some of the time here,
  // but only rarely if the type is non-nullable (because in that case we'd need
  // to add a ref.as_non_null to validate, and the code will trap when we get
  // here).
  if ((type.isNullable() && oneIn(2)) ||
      (type.isNonNullable() && oneIn(16) && funcContext)) {
    Expression* ret = builder.makeRefNull(HeapTypes::nofunc.getBasic(share));
    if (!type.isNullable()) {
      assert(funcContext);
      ret = builder.makeRefAs(RefAsNonNull, ret);
    }
    return ret;
  }
  // As a final option, create a new function with the correct signature. If it
  // returns a value, write a trap as we do not want to create any more code
  // here (we might end up recursing). Note that a trap in the function lets us
  // execute more code then the ref.as_non_null path just before us, which traps
  // even if we never call the function.
  if (heapType.isBasic()) {
    // We need a specific signature type to create a function. Pick an arbitrary
    // signature if we only had generic 'func' here.
    TypeBuilder builder(1);
    builder[0] = Signature(Type::none, Type::none);
    builder[0].setShared(share);
    heapType = (*builder.build())[0];
  }
  auto* body = heapType.getSignature().results == Type::none
                 ? (Expression*)builder.makeNop()
                 : (Expression*)builder.makeUnreachable();
  auto* func = wasm.addFunction(builder.makeFunction(
    Names::getValidFunctionName(wasm, "ref_func_target"), heapType, {}, body));
  return builder.makeRefFunc(func->name, heapType);
}